

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.c
# Opt level: O3

void update_key(SDL_Keycode sdlk,_Bool state)

{
  KEYINPUT_t *pKVar1;
  uint16_t uVar2;
  ushort uVar4;
  int i;
  ushort uVar3;
  
  pKVar1 = get_keyinput();
  if (sdlk < 0x61) {
    switch(sdlk) {
    case 0x30:
      i = 9;
      break;
    case 0x31:
      i = 0;
      break;
    case 0x32:
      i = 1;
      break;
    case 0x33:
      i = 2;
      break;
    case 0x34:
      i = 3;
      break;
    case 0x35:
      i = 4;
      break;
    case 0x36:
      i = 5;
      break;
    case 0x37:
      i = 6;
      break;
    case 0x38:
      i = 7;
      break;
    case 0x39:
      i = 8;
      break;
    default:
      if (sdlk != 0xd) {
        if (sdlk != 0x1b) {
          return;
        }
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  User pressed escape\n\x1b[0;m");
        }
        if (ctrl_state == true) {
          should_quit = true;
          return;
        }
        return;
      }
      uVar2 = (pKVar1->raw & 0xfff7) + (ushort)!state * 8;
      goto LAB_0011ae7f;
    }
    save_load(state,i);
    return;
  }
  if (sdlk < 0x4000004f) {
    if (sdlk < 0x71) {
      switch(sdlk) {
      case 0x61:
switchD_0011acf1_caseD_61:
        uVar4 = (ushort)!state << 5;
        uVar3 = pKVar1->raw & 0xffdf;
        break;
      default:
        goto switchD_0011acf1_caseD_62;
      case 100:
switchD_0011acf1_caseD_64:
        uVar4 = (ushort)!state << 4;
        uVar3 = pKVar1->raw & 0xffef;
        break;
      case 0x65:
        uVar4 = (ushort)!state << 8;
        uVar3 = pKVar1->raw & 0xfeff;
        break;
      case 0x6a:
        pKVar1->raw = pKVar1->raw & 0xfffe | (ushort)!state;
        return;
      case 0x6b:
        uVar2 = (pKVar1->raw & 0xfffd) + (ushort)!state * 2;
        goto LAB_0011ae7f;
      }
    }
    else if (sdlk == 0x71) {
      uVar4 = (ushort)!state << 9;
      uVar3 = pKVar1->raw & 0xfdff;
    }
    else {
      if (sdlk == 0x73) goto switchD_0011ad5c_caseD_40000051;
      if (sdlk != 0x77) {
        return;
      }
switchD_0011ad5c_caseD_40000052:
      uVar4 = (ushort)!state << 6;
      uVar3 = pKVar1->raw & 0xffbf;
    }
  }
  else {
    if (0x400000df < sdlk) {
      if (sdlk == 0x400000e0) {
        ctrl_state = state;
        return;
      }
      if (sdlk != 0x400000e5) {
        if (sdlk == 0x400000e4) {
          ctrl_state = state;
          return;
        }
        return;
      }
      uVar2 = (pKVar1->raw & 0xfffb) + (ushort)!state * 4;
      goto LAB_0011ae7f;
    }
    switch(sdlk) {
    case 0x4000004f:
      goto switchD_0011acf1_caseD_64;
    case 0x40000050:
      goto switchD_0011acf1_caseD_61;
    case 0x40000051:
switchD_0011ad5c_caseD_40000051:
      uVar4 = (ushort)!state << 7;
      uVar3 = pKVar1->raw & 0xff7f;
      break;
    case 0x40000052:
      goto switchD_0011ad5c_caseD_40000052;
    default:
      goto switchD_0011acf1_caseD_62;
    }
  }
  uVar2 = uVar3 | uVar4;
LAB_0011ae7f:
  pKVar1->raw = uVar2;
switchD_0011acf1_caseD_62:
  return;
}

Assistant:

void update_key(SDL_Keycode sdlk, bool state) {
    KEYINPUT_t* KEYINPUT = get_keyinput();
    switch (sdlk) {
        case SDLK_LCTRL:
        case SDLK_RCTRL:
            ctrl_state = state;
            break;
        case SDLK_ESCAPE:
            logwarn("User pressed escape")
            if (ctrl_state) {
                should_quit = true;
            }
            break;
        case SDLK_UP:
        case SDLK_w:
            KEYINPUT->up = !state;
            break;
        case SDLK_DOWN:
        case SDLK_s:
            KEYINPUT->down = !state;
            break;
        case SDLK_LEFT:
        case SDLK_a:
            KEYINPUT->left = !state;
            break;
        case SDLK_RIGHT:
        case SDLK_d:
            KEYINPUT->right = !state;
            break;
        case SDLK_j:
            KEYINPUT->a = !state;
            break;
        case SDLK_k:
            KEYINPUT->b = !state;
            break;
        case SDLK_RETURN:
            KEYINPUT->start = !state;
            break;
        case SDLK_RSHIFT:
            KEYINPUT->select = !state;
            break;
        case SDLK_q:
            KEYINPUT->l = !state;
            break;
        case SDLK_e:
            KEYINPUT->r = !state;
            break;
        case SDLK_1:
            save_load(state, 0);
            break;
        case SDLK_2:
            save_load(state, 1);
            break;
        case SDLK_3:
            save_load(state, 2);
            break;
        case SDLK_4:
            save_load(state, 3);
            break;
        case SDLK_5:
            save_load(state, 4);
            break;
        case SDLK_6:
            save_load(state, 5);
            break;
        case SDLK_7:
            save_load(state, 6);
            break;
        case SDLK_8:
            save_load(state, 7);
            break;
        case SDLK_9:
            save_load(state, 8);
            break;
        case SDLK_0:
            save_load(state, 9);
            break;
        default:
            break;
    }
}